

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::MakeDirectory(string *path)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  string topdir;
  string dir;
  string local_48 [32];
  
  bVar1 = FileExists(path);
  if (bVar1) {
    bVar1 = FileIsDirectory(path);
    return bVar1;
  }
  if (path->_M_string_length != 0) {
    std::__cxx11::string::string((string *)&dir,(string *)path);
    ConvertToUnixSlashes(&dir);
    topdir._M_dataplus._M_p = (pointer)&topdir.field_2;
    topdir._M_string_length = 0;
    topdir.field_2._M_local_buf[0] = '\0';
    while (lVar3 = std::__cxx11::string::find((char)&dir,0x2f), lVar3 != -1) {
      std::__cxx11::string::substr((ulong)local_48,(ulong)&dir);
      std::__cxx11::string::operator=((string *)&topdir,local_48);
      std::__cxx11::string::~string(local_48);
      Mkdir(&topdir);
    }
    std::__cxx11::string::_M_assign((string *)&topdir);
    iVar2 = Mkdir(&topdir);
    if ((iVar2 == 0) || (piVar4 = __errno_location(), *piVar4 == 0x11)) {
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&topdir);
    std::__cxx11::string::~string((string *)&dir);
    return bVar1;
  }
  return false;
}

Assistant:

bool SystemTools::MakeDirectory(const kwsys_stl::string& path)
{
  if(SystemTools::FileExists(path))
    {
    return SystemTools::FileIsDirectory(path);
    }
  if(path.empty())
    {
    return false;
    }
  kwsys_stl::string dir = path;
  SystemTools::ConvertToUnixSlashes(dir);

  kwsys_stl::string::size_type pos = 0;
  kwsys_stl::string topdir;
  while((pos = dir.find('/', pos)) != kwsys_stl::string::npos)
    {
    topdir = dir.substr(0, pos);
    Mkdir(topdir);
    pos++;
    }
  topdir = dir;
  if(Mkdir(topdir) != 0)
    {
    // There is a bug in the Borland Run time library which makes MKDIR
    // return EACCES when it should return EEXISTS
    // if it is some other error besides directory exists
    // then return false
    if( (errno != EEXIST)
#ifdef __BORLANDC__
        && (errno != EACCES)
#endif
      )
      {
      return false;
      }
    }
  return true;
}